

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase50::run(TestCase50 *this)

{
  size_t sVar1;
  String *pSVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  undefined1 *puVar6;
  undefined8 *puVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  char *pcVar11;
  char **ppcVar12;
  char *pcVar13;
  size_t *psVar14;
  bool bVar15;
  StringPtr originalText;
  StringPtr originalText_00;
  StringPtr originalText_01;
  StringPtr originalText_02;
  StringPtr originalText_03;
  StringPtr originalText_04;
  StringPtr originalText_05;
  StringPtr originalText_06;
  StringPtr originalText_07;
  StringPtr originalText_08;
  StringPtr originalText_09;
  StringPtr originalText_10;
  StringPtr originalText_11;
  StringPtr originalText_12;
  StringPtr originalText_13;
  StringPtr originalText_14;
  StringPtr originalText_15;
  StringPtr originalText_16;
  StringPtr originalText_17;
  StringPtr originalText_18;
  StringPtr originalText_19;
  StringPtr originalText_20;
  StringPtr originalText_21;
  StringPtr originalText_22;
  StringPtr originalText_23;
  StringPtr originalText_24;
  StringPtr originalText_25;
  StringPtr originalText_26;
  StringPtr originalText_27;
  StringPtr originalText_28;
  StringPtr originalText_29;
  StringPtr originalText_30;
  StringPtr expectedRestringified;
  StringPtr expectedRestringified_00;
  StringPtr expectedRestringified_01;
  StringPtr expectedRestringified_02;
  StringPtr expectedRestringified_03;
  StringPtr expectedRestringified_04;
  StringPtr expectedRestringified_05;
  StringPtr expectedRestringified_06;
  StringPtr expectedRestringified_07;
  StringPtr expectedRestringified_08;
  StringPtr expectedRestringified_09;
  StringPtr expectedRestringified_10;
  StringPtr expectedRestringified_11;
  StringPtr expectedRestringified_12;
  StringPtr expectedRestringified_13;
  StringPtr expectedRestringified_14;
  StringPtr expectedRestringified_15;
  StringPtr expectedRestringified_16;
  StringPtr expectedRestringified_17;
  StringPtr expectedRestringified_18;
  StringPtr expectedRestringified_19;
  StringPtr expectedRestringified_20;
  StringPtr expectedRestringified_21;
  StringPtr expectedRestringified_22;
  StringPtr expectedRestringified_23;
  StringPtr expectedRestringified_24;
  StringPtr expectedRestringified_25;
  StringPtr expectedRestringified_26;
  StringPtr expectedRestringified_27;
  StringPtr expectedRestringified_28;
  StringPtr expectedRestringified_29;
  StringPtr expectedRestringified_30;
  Fault f;
  Url url;
  Fault local_ae0;
  char *local_ad8;
  undefined8 uStack_ad0;
  char *local_ac8 [3];
  Url local_ab0;
  Url local_9d0;
  Url local_8f0;
  Url local_810;
  Url local_730;
  Url local_650;
  Url local_570;
  Url local_490;
  Url local_3b0;
  Url local_2d0;
  Url local_1f0;
  Url local_110;
  
  originalText.content.size_ = 0x16;
  originalText.content.ptr = "https://capnproto.org";
  expectedRestringified.content.size_ = 1;
  expectedRestringified.content.ptr = "";
  parseAndCheck(&local_ab0,originalText,expectedRestringified,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x35,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x36,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x37,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  if ((local_ab0.path.builder.pos != local_ab0.path.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x38,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
               (char (*) [37])"failed: expected url.path == nullptr");
  }
  if ((local_ab0.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((local_ab0.query.builder.pos != local_ab0.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x3a,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if ((local_ab0.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x3b,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
               (char (*) [41])"failed: expected url.fragment == nullptr");
  }
  Url::~Url(&local_ab0);
  originalText_00.content.size_ = 0x19;
  originalText_00.content.ptr = "https://capnproto.org:80";
  expectedRestringified_00.content.size_ = 1;
  expectedRestringified_00.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_00,expectedRestringified_00,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x40,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x41,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0x11) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org:80",0x10), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x42,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org:80\\\"\"",
               (char (*) [48])"failed: expected url.host == \"capnproto.org:80\"");
  }
  if ((local_ab0.path.builder.pos != local_ab0.path.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x43,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
               (char (*) [37])"failed: expected url.path == nullptr");
  }
  if ((local_ab0.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x44,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((local_ab0.query.builder.pos != local_ab0.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x45,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if ((local_ab0.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x46,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
               (char (*) [41])"failed: expected url.fragment == nullptr");
  }
  Url::~Url(&local_ab0);
  originalText_01.content.size_ = 0x17;
  originalText_01.content.ptr = "https://capnproto.org/";
  expectedRestringified_01.content.size_ = 1;
  expectedRestringified_01.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_01,expectedRestringified_01,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x4b,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x4c,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x4d,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  if ((local_ab0.path.builder.pos != local_ab0.path.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x4e,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
               (char (*) [37])"failed: expected url.path == nullptr");
  }
  if ((local_ab0.hasTrailingSlash == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x4f,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
               (char (*) [38])"failed: expected url.hasTrailingSlash");
  }
  if ((local_ab0.query.builder.pos != local_ab0.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x50,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if ((local_ab0.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x51,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
               (char (*) [41])"failed: expected url.fragment == nullptr");
  }
  Url::~Url(&local_ab0);
  pcVar11 = "";
  originalText_02.content.size_ = 0x1e;
  originalText_02.content.ptr = "https://capnproto.org/foo/bar";
  expectedRestringified_02.content.size_ = 1;
  expectedRestringified_02.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_02,expectedRestringified_02,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x56,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x57,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x58,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  pSVar2 = local_ab0.path.builder.ptr;
  local_ad8 = "foo";
  uStack_ad0 = 4;
  local_ac8[0] = "bar";
  local_ac8[1] = (char *)0x4;
  if ((long)local_ab0.path.builder.pos - (long)local_ab0.path.builder.ptr == 0x30) {
    sVar1 = ((local_ab0.path.builder.ptr)->content).size_;
    if (sVar1 + (sVar1 == 0) == 4) {
      if (sVar1 != 0) {
        pcVar11 = ((local_ab0.path.builder.ptr)->content).ptr;
      }
      iVar5 = bcmp(pcVar11,"foo",3);
      if (iVar5 != 0) goto LAB_00264446;
      ppcVar12 = local_ac8 + 1;
      psVar14 = &pSVar2[1].content.size_;
      uVar3 = 1;
      do {
        uVar9 = uVar3;
        if (uVar9 == 2) break;
        sVar1 = *psVar14;
        pcVar11 = (char *)(sVar1 + (sVar1 == 0));
        if (pcVar11 != *ppcVar12) break;
        pcVar13 = "";
        if (sVar1 != 0) {
          pcVar13 = ((Array<char> *)(psVar14 + -1))->ptr;
        }
        iVar5 = bcmp(pcVar13,ppcVar12[-1],(size_t)(pcVar11 + 0xffffffffffffffff));
        ppcVar12 = ppcVar12 + 2;
        psVar14 = psVar14 + 3;
        uVar3 = uVar9 + 1;
      } while (iVar5 == 0);
      bVar15 = 1 < uVar9;
    }
    else {
LAB_00264446:
      bVar15 = false;
    }
    if (!bVar15) goto joined_r0x0026445a;
  }
  else {
joined_r0x0026445a:
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x59,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
    }
  }
  if ((local_ab0.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x5a,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((local_ab0.query.builder.pos != local_ab0.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x5b,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if ((local_ab0.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x5c,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
               (char (*) [41])"failed: expected url.fragment == nullptr");
  }
  Url::~Url(&local_ab0);
  pcVar11 = "";
  originalText_03.content.size_ = 0x1f;
  originalText_03.content.ptr = "https://capnproto.org/foo/bar/";
  expectedRestringified_03.content.size_ = 1;
  expectedRestringified_03.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_03,expectedRestringified_03,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x61,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x62,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,99,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  pSVar2 = local_ab0.path.builder.ptr;
  local_ad8 = "foo";
  uStack_ad0 = 4;
  local_ac8[0] = "bar";
  local_ac8[1] = (char *)0x4;
  if ((long)local_ab0.path.builder.pos - (long)local_ab0.path.builder.ptr == 0x30) {
    sVar1 = ((local_ab0.path.builder.ptr)->content).size_;
    if (sVar1 + (sVar1 == 0) == 4) {
      if (sVar1 != 0) {
        pcVar11 = ((local_ab0.path.builder.ptr)->content).ptr;
      }
      iVar5 = bcmp(pcVar11,"foo",3);
      if (iVar5 != 0) goto LAB_002646a2;
      ppcVar12 = local_ac8 + 1;
      psVar14 = &pSVar2[1].content.size_;
      uVar3 = 1;
      do {
        uVar9 = uVar3;
        if (uVar9 == 2) break;
        sVar1 = *psVar14;
        pcVar11 = (char *)(sVar1 + (sVar1 == 0));
        if (pcVar11 != *ppcVar12) break;
        pcVar13 = "";
        if (sVar1 != 0) {
          pcVar13 = ((Array<char> *)(psVar14 + -1))->ptr;
        }
        iVar5 = bcmp(pcVar13,ppcVar12[-1],(size_t)(pcVar11 + 0xffffffffffffffff));
        ppcVar12 = ppcVar12 + 2;
        psVar14 = psVar14 + 3;
        uVar3 = uVar9 + 1;
      } while (iVar5 == 0);
      bVar15 = 1 < uVar9;
    }
    else {
LAB_002646a2:
      bVar15 = false;
    }
    if (!bVar15) goto joined_r0x002646b6;
  }
  else {
joined_r0x002646b6:
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,100,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
    }
  }
  if ((local_ab0.hasTrailingSlash == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x65,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
               (char (*) [38])"failed: expected url.hasTrailingSlash");
  }
  if ((local_ab0.query.builder.pos != local_ab0.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x66,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if ((local_ab0.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x67,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
               (char (*) [41])"failed: expected url.fragment == nullptr");
  }
  Url::~Url(&local_ab0);
  pcVar11 = "";
  originalText_04.content.size_ = 0x33;
  originalText_04.content.ptr = "https://capnproto.org/foo/bar?baz=qux&corge#garply";
  expectedRestringified_04.content.size_ = 1;
  expectedRestringified_04.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_04,expectedRestringified_04,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x6c,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x6d,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x6e,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  pSVar2 = local_ab0.path.builder.ptr;
  local_ad8 = "foo";
  uStack_ad0 = 4;
  local_ac8[0] = "bar";
  local_ac8[1] = (char *)0x4;
  if ((long)local_ab0.path.builder.pos - (long)local_ab0.path.builder.ptr == 0x30) {
    sVar1 = ((local_ab0.path.builder.ptr)->content).size_;
    if (sVar1 + (sVar1 == 0) == 4) {
      if (sVar1 != 0) {
        pcVar11 = ((local_ab0.path.builder.ptr)->content).ptr;
      }
      iVar5 = bcmp(pcVar11,"foo",3);
      if (iVar5 != 0) goto LAB_002648fe;
      ppcVar12 = local_ac8 + 1;
      psVar14 = &pSVar2[1].content.size_;
      uVar3 = 1;
      do {
        uVar9 = uVar3;
        if (uVar9 == 2) break;
        sVar1 = *psVar14;
        pcVar11 = (char *)(sVar1 + (sVar1 == 0));
        if (pcVar11 != *ppcVar12) break;
        pcVar13 = "";
        if (sVar1 != 0) {
          pcVar13 = ((Array<char> *)(psVar14 + -1))->ptr;
        }
        iVar5 = bcmp(pcVar13,ppcVar12[-1],(size_t)(pcVar11 + 0xffffffffffffffff));
        ppcVar12 = ppcVar12 + 2;
        psVar14 = psVar14 + 3;
        uVar3 = uVar9 + 1;
      } while (iVar5 == 0);
      bVar15 = 1 < uVar9;
    }
    else {
LAB_002648fe:
      bVar15 = false;
    }
    if (!bVar15) goto joined_r0x00264912;
  }
  else {
joined_r0x00264912:
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x6f,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
    }
  }
  if ((local_ab0.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x70,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((long)local_ab0.query.builder.pos - (long)local_ab0.query.builder.ptr != 0x60) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((((local_ab0.query.builder.ptr)->name).content.size_ != 4) ||
      (iVar5 = bcmp(((local_ab0.query.builder.ptr)->name).content.ptr,"baz",3), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x72,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
               (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
  }
  if (((((local_ab0.query.builder.ptr)->value).content.size_ != 4) ||
      (iVar5 = bcmp(((local_ab0.query.builder.ptr)->value).content.ptr,"qux",3), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x73,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux\\\"\"",
               (char (*) [45])"failed: expected url.query[0].value == \"qux\"");
  }
  if (((local_ab0.query.builder.ptr[1].name.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.query.builder.ptr[1].name.content.ptr,"corge",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x74,ERROR,"\"failed: expected \" \"url.query[1].name == \\\"corge\\\"\"",
               (char (*) [46])"failed: expected url.query[1].name == \"corge\"");
  }
  if ((1 < local_ab0.query.builder.ptr[1].value.content.size_) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x75,ERROR,"\"failed: expected \" \"url.query[1].value == nullptr\"",
               (char (*) [47])"failed: expected url.query[1].value == nullptr");
  }
  if (local_ab0.fragment.ptr.isSet == false) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((local_ab0.fragment.ptr.field_1.value.content.size_ != 7) ||
      (iVar5 = bcmp(local_ab0.fragment.ptr.field_1.value.content.ptr,"garply",6), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x76,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
               (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
  }
  Url::~Url(&local_ab0);
  pcVar11 = "";
  originalText_05.content.size_ = 0x34;
  originalText_05.content.ptr = "https://capnproto.org/foo/bar?baz=qux&corge=#garply";
  expectedRestringified_05.content.size_ = 1;
  expectedRestringified_05.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_05,expectedRestringified_05,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x7b,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x7c,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x7d,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  pSVar2 = local_ab0.path.builder.ptr;
  local_ad8 = "foo";
  uStack_ad0 = 4;
  local_ac8[0] = "bar";
  local_ac8[1] = (char *)0x4;
  if ((long)local_ab0.path.builder.pos - (long)local_ab0.path.builder.ptr == 0x30) {
    sVar1 = ((local_ab0.path.builder.ptr)->content).size_;
    if (sVar1 + (sVar1 == 0) == 4) {
      if (sVar1 != 0) {
        pcVar11 = ((local_ab0.path.builder.ptr)->content).ptr;
      }
      iVar5 = bcmp(pcVar11,"foo",3);
      if (iVar5 != 0) goto LAB_00264c94;
      ppcVar12 = local_ac8 + 1;
      psVar14 = &pSVar2[1].content.size_;
      uVar3 = 1;
      do {
        uVar9 = uVar3;
        if (uVar9 == 2) break;
        sVar1 = *psVar14;
        pcVar11 = (char *)(sVar1 + (sVar1 == 0));
        if (pcVar11 != *ppcVar12) break;
        pcVar13 = "";
        if (sVar1 != 0) {
          pcVar13 = ((Array<char> *)(psVar14 + -1))->ptr;
        }
        iVar5 = bcmp(pcVar13,ppcVar12[-1],(size_t)(pcVar11 + 0xffffffffffffffff));
        ppcVar12 = ppcVar12 + 2;
        psVar14 = psVar14 + 3;
        uVar3 = uVar9 + 1;
      } while (iVar5 == 0);
      bVar15 = 1 < uVar9;
    }
    else {
LAB_00264c94:
      bVar15 = false;
    }
    if (!bVar15) goto joined_r0x00264ca8;
  }
  else {
joined_r0x00264ca8:
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x7e,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
    }
  }
  if ((local_ab0.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x7f,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((long)local_ab0.query.builder.pos - (long)local_ab0.query.builder.ptr != 0x60) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((((local_ab0.query.builder.ptr)->name).content.size_ != 4) ||
      (iVar5 = bcmp(((local_ab0.query.builder.ptr)->name).content.ptr,"baz",3), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x81,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
               (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
  }
  if (((((local_ab0.query.builder.ptr)->value).content.size_ != 4) ||
      (iVar5 = bcmp(((local_ab0.query.builder.ptr)->value).content.ptr,"qux",3), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x82,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux\\\"\"",
               (char (*) [45])"failed: expected url.query[0].value == \"qux\"");
  }
  if (((local_ab0.query.builder.ptr[1].name.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.query.builder.ptr[1].name.content.ptr,"corge",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x83,ERROR,"\"failed: expected \" \"url.query[1].name == \\\"corge\\\"\"",
               (char (*) [46])"failed: expected url.query[1].name == \"corge\"");
  }
  if ((1 < local_ab0.query.builder.ptr[1].value.content.size_) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x84,ERROR,"\"failed: expected \" \"url.query[1].value == nullptr\"",
               (char (*) [47])"failed: expected url.query[1].value == nullptr");
  }
  if (local_ab0.fragment.ptr.isSet == false) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((local_ab0.fragment.ptr.field_1.value.content.size_ != 7) ||
      (iVar5 = bcmp(local_ab0.fragment.ptr.field_1.value.content.ptr,"garply",6), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x85,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
               (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
  }
  Url::~Url(&local_ab0);
  pcVar11 = "";
  originalText_06.content.size_ = 0x37;
  originalText_06.content.ptr = "https://capnproto.org/foo/bar?baz=&corge=grault#garply";
  expectedRestringified_06.content.size_ = 1;
  expectedRestringified_06.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_06,expectedRestringified_06,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x8a,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x8b,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x8c,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  pSVar2 = local_ab0.path.builder.ptr;
  local_ad8 = "foo";
  uStack_ad0 = 4;
  local_ac8[0] = "bar";
  local_ac8[1] = (char *)0x4;
  if ((long)local_ab0.path.builder.pos - (long)local_ab0.path.builder.ptr == 0x30) {
    sVar1 = ((local_ab0.path.builder.ptr)->content).size_;
    if (sVar1 + (sVar1 == 0) == 4) {
      if (sVar1 != 0) {
        pcVar11 = ((local_ab0.path.builder.ptr)->content).ptr;
      }
      iVar5 = bcmp(pcVar11,"foo",3);
      if (iVar5 != 0) goto LAB_0026502a;
      ppcVar12 = local_ac8 + 1;
      psVar14 = &pSVar2[1].content.size_;
      uVar3 = 1;
      do {
        uVar9 = uVar3;
        if (uVar9 == 2) break;
        sVar1 = *psVar14;
        pcVar11 = (char *)(sVar1 + (sVar1 == 0));
        if (pcVar11 != *ppcVar12) break;
        pcVar13 = "";
        if (sVar1 != 0) {
          pcVar13 = ((Array<char> *)(psVar14 + -1))->ptr;
        }
        iVar5 = bcmp(pcVar13,ppcVar12[-1],(size_t)(pcVar11 + 0xffffffffffffffff));
        ppcVar12 = ppcVar12 + 2;
        psVar14 = psVar14 + 3;
        uVar3 = uVar9 + 1;
      } while (iVar5 == 0);
      bVar15 = 1 < uVar9;
    }
    else {
LAB_0026502a:
      bVar15 = false;
    }
    if (!bVar15) goto joined_r0x0026503e;
  }
  else {
joined_r0x0026503e:
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x8d,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
    }
  }
  if ((local_ab0.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x8e,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((long)local_ab0.query.builder.pos - (long)local_ab0.query.builder.ptr != 0x60) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((((local_ab0.query.builder.ptr)->name).content.size_ != 4) ||
      (iVar5 = bcmp(((local_ab0.query.builder.ptr)->name).content.ptr,"baz",3), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x90,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
               (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
  }
  if ((1 < ((local_ab0.query.builder.ptr)->value).content.size_) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x91,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"\\\"\"",
               (char (*) [42])"failed: expected url.query[0].value == \"\"");
  }
  if (((local_ab0.query.builder.ptr[1].name.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.query.builder.ptr[1].name.content.ptr,"corge",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x92,ERROR,"\"failed: expected \" \"url.query[1].name == \\\"corge\\\"\"",
               (char (*) [46])"failed: expected url.query[1].name == \"corge\"");
  }
  if (((local_ab0.query.builder.ptr[1].value.content.size_ != 7) ||
      (iVar5 = bcmp(local_ab0.query.builder.ptr[1].value.content.ptr,"grault",6), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x93,ERROR,"\"failed: expected \" \"url.query[1].value == \\\"grault\\\"\"",
               (char (*) [48])"failed: expected url.query[1].value == \"grault\"");
  }
  if (local_ab0.fragment.ptr.isSet == false) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((local_ab0.fragment.ptr.field_1.value.content.size_ != 7) ||
      (iVar5 = bcmp(local_ab0.fragment.ptr.field_1.value.content.ptr,"garply",6), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x94,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
               (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
  }
  Url::~Url(&local_ab0);
  pcVar11 = "";
  originalText_07.content.size_ = 0x3b;
  originalText_07.content.ptr = "https://capnproto.org/foo/bar/?baz=qux&corge=grault#garply";
  expectedRestringified_07.content.size_ = 1;
  expectedRestringified_07.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_07,expectedRestringified_07,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x99,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x9a,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x9b,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  pSVar2 = local_ab0.path.builder.ptr;
  local_ad8 = "foo";
  uStack_ad0 = 4;
  local_ac8[0] = "bar";
  local_ac8[1] = (char *)0x4;
  if ((long)local_ab0.path.builder.pos - (long)local_ab0.path.builder.ptr == 0x30) {
    sVar1 = ((local_ab0.path.builder.ptr)->content).size_;
    if (sVar1 + (sVar1 == 0) == 4) {
      if (sVar1 != 0) {
        pcVar11 = ((local_ab0.path.builder.ptr)->content).ptr;
      }
      iVar5 = bcmp(pcVar11,"foo",3);
      if (iVar5 != 0) goto LAB_002653c0;
      ppcVar12 = local_ac8 + 1;
      psVar14 = &pSVar2[1].content.size_;
      uVar3 = 1;
      do {
        uVar9 = uVar3;
        if (uVar9 == 2) break;
        sVar1 = *psVar14;
        pcVar11 = (char *)(sVar1 + (sVar1 == 0));
        if (pcVar11 != *ppcVar12) break;
        pcVar13 = "";
        if (sVar1 != 0) {
          pcVar13 = ((Array<char> *)(psVar14 + -1))->ptr;
        }
        iVar5 = bcmp(pcVar13,ppcVar12[-1],(size_t)(pcVar11 + 0xffffffffffffffff));
        ppcVar12 = ppcVar12 + 2;
        psVar14 = psVar14 + 3;
        uVar3 = uVar9 + 1;
      } while (iVar5 == 0);
      bVar15 = 1 < uVar9;
    }
    else {
LAB_002653c0:
      bVar15 = false;
    }
    if (!bVar15) goto joined_r0x002653d4;
  }
  else {
joined_r0x002653d4:
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x9c,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
    }
  }
  if ((local_ab0.hasTrailingSlash == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x9d,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
               (char (*) [38])"failed: expected url.hasTrailingSlash");
  }
  if ((long)local_ab0.query.builder.pos - (long)local_ab0.query.builder.ptr != 0x60) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((((local_ab0.query.builder.ptr)->name).content.size_ != 4) ||
      (iVar5 = bcmp(((local_ab0.query.builder.ptr)->name).content.ptr,"baz",3), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x9f,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
               (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
  }
  if (((((local_ab0.query.builder.ptr)->value).content.size_ != 4) ||
      (iVar5 = bcmp(((local_ab0.query.builder.ptr)->value).content.ptr,"qux",3), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xa0,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux\\\"\"",
               (char (*) [45])"failed: expected url.query[0].value == \"qux\"");
  }
  if (((local_ab0.query.builder.ptr[1].name.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.query.builder.ptr[1].name.content.ptr,"corge",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xa1,ERROR,"\"failed: expected \" \"url.query[1].name == \\\"corge\\\"\"",
               (char (*) [46])"failed: expected url.query[1].name == \"corge\"");
  }
  if (((local_ab0.query.builder.ptr[1].value.content.size_ != 7) ||
      (iVar5 = bcmp(local_ab0.query.builder.ptr[1].value.content.ptr,"grault",6), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xa2,ERROR,"\"failed: expected \" \"url.query[1].value == \\\"grault\\\"\"",
               (char (*) [48])"failed: expected url.query[1].value == \"grault\"");
  }
  if (local_ab0.fragment.ptr.isSet == false) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((local_ab0.fragment.ptr.field_1.value.content.size_ != 7) ||
      (iVar5 = bcmp(local_ab0.fragment.ptr.field_1.value.content.ptr,"garply",6), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xa3,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
               (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
  }
  Url::~Url(&local_ab0);
  pcVar11 = "";
  originalText_08.content.size_ = 0x2d;
  originalText_08.content.ptr = "https://capnproto.org/foo/bar?baz=qux#garply";
  expectedRestringified_08.content.size_ = 1;
  expectedRestringified_08.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_08,expectedRestringified_08,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xa8,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xa9,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xaa,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  pSVar2 = local_ab0.path.builder.ptr;
  local_ad8 = "foo";
  uStack_ad0 = 4;
  local_ac8[0] = "bar";
  local_ac8[1] = (char *)0x4;
  if ((long)local_ab0.path.builder.pos - (long)local_ab0.path.builder.ptr == 0x30) {
    sVar1 = ((local_ab0.path.builder.ptr)->content).size_;
    if (sVar1 + (sVar1 == 0) == 4) {
      if (sVar1 != 0) {
        pcVar11 = ((local_ab0.path.builder.ptr)->content).ptr;
      }
      iVar5 = bcmp(pcVar11,"foo",3);
      if (iVar5 != 0) goto LAB_00265770;
      ppcVar12 = local_ac8 + 1;
      psVar14 = &pSVar2[1].content.size_;
      uVar3 = 1;
      do {
        uVar9 = uVar3;
        if (uVar9 == 2) break;
        sVar1 = *psVar14;
        pcVar11 = (char *)(sVar1 + (sVar1 == 0));
        if (pcVar11 != *ppcVar12) break;
        pcVar13 = "";
        if (sVar1 != 0) {
          pcVar13 = ((Array<char> *)(psVar14 + -1))->ptr;
        }
        iVar5 = bcmp(pcVar13,ppcVar12[-1],(size_t)(pcVar11 + 0xffffffffffffffff));
        ppcVar12 = ppcVar12 + 2;
        psVar14 = psVar14 + 3;
        uVar3 = uVar9 + 1;
      } while (iVar5 == 0);
      bVar15 = 1 < uVar9;
    }
    else {
LAB_00265770:
      bVar15 = false;
    }
    if (!bVar15) goto joined_r0x00265784;
  }
  else {
joined_r0x00265784:
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xab,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
    }
  }
  if ((local_ab0.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xac,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((long)local_ab0.query.builder.pos - (long)local_ab0.query.builder.ptr != 0x30) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((((local_ab0.query.builder.ptr)->name).content.size_ != 4) ||
      (iVar5 = bcmp(((local_ab0.query.builder.ptr)->name).content.ptr,"baz",3), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xae,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"baz\\\"\"",
               (char (*) [44])"failed: expected url.query[0].name == \"baz\"");
  }
  if (((((local_ab0.query.builder.ptr)->value).content.size_ != 4) ||
      (iVar5 = bcmp(((local_ab0.query.builder.ptr)->value).content.ptr,"qux",3), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xaf,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux\\\"\"",
               (char (*) [45])"failed: expected url.query[0].value == \"qux\"");
  }
  if (local_ab0.fragment.ptr.isSet == false) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((local_ab0.fragment.ptr.field_1.value.content.size_ != 7) ||
      (iVar5 = bcmp(local_ab0.fragment.ptr.field_1.value.content.ptr,"garply",6), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xb0,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
               (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
  }
  Url::~Url(&local_ab0);
  originalText_09.content.size_ = 0x2d;
  originalText_09.content.ptr = "https://capnproto.org/foo?bar%20baz=qux+quux";
  expectedRestringified_09.content.size_ = 0x2b;
  expectedRestringified_09.content.ptr = "https://capnproto.org/foo?bar+baz=qux+quux";
  parseAndCheck(&local_ab0,originalText_09,expectedRestringified_09,(Options)0x1);
  if ((long)local_ab0.query.builder.pos - (long)local_ab0.query.builder.ptr != 0x30) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((((local_ab0.query.builder.ptr)->name).content.size_ != 8) ||
      (iVar5 = bcmp(((local_ab0.query.builder.ptr)->name).content.ptr,"bar baz",7), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xb7,ERROR,"\"failed: expected \" \"url.query[0].name == \\\"bar baz\\\"\"",
               (char (*) [48])"failed: expected url.query[0].name == \"bar baz\"");
  }
  if (((((local_ab0.query.builder.ptr)->value).content.size_ != 9) ||
      (iVar5 = bcmp(((local_ab0.query.builder.ptr)->value).content.ptr,"qux quux",8), iVar5 != 0))
     && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[50]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xb8,ERROR,"\"failed: expected \" \"url.query[0].value == \\\"qux quux\\\"\"",
               (char (*) [50])"failed: expected url.query[0].value == \"qux quux\"");
  }
  Url::~Url(&local_ab0);
  pcVar11 = "";
  originalText_10.content.size_ = 0x25;
  originalText_10.content.ptr = "https://capnproto.org/foo/bar#garply";
  expectedRestringified_10.content.size_ = 1;
  expectedRestringified_10.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_10,expectedRestringified_10,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xbd,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xbe,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xbf,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  pSVar2 = local_ab0.path.builder.ptr;
  local_ad8 = "foo";
  uStack_ad0 = 4;
  local_ac8[0] = "bar";
  local_ac8[1] = (char *)0x4;
  if ((long)local_ab0.path.builder.pos - (long)local_ab0.path.builder.ptr == 0x30) {
    sVar1 = ((local_ab0.path.builder.ptr)->content).size_;
    if (sVar1 + (sVar1 == 0) == 4) {
      if (sVar1 != 0) {
        pcVar11 = ((local_ab0.path.builder.ptr)->content).ptr;
      }
      iVar5 = bcmp(pcVar11,"foo",3);
      if (iVar5 != 0) goto LAB_00265b68;
      ppcVar12 = local_ac8 + 1;
      psVar14 = &pSVar2[1].content.size_;
      uVar3 = 1;
      do {
        uVar9 = uVar3;
        if (uVar9 == 2) break;
        sVar1 = *psVar14;
        pcVar11 = (char *)(sVar1 + (sVar1 == 0));
        if (pcVar11 != *ppcVar12) break;
        pcVar13 = "";
        if (sVar1 != 0) {
          pcVar13 = ((Array<char> *)(psVar14 + -1))->ptr;
        }
        iVar5 = bcmp(pcVar13,ppcVar12[-1],(size_t)(pcVar11 + 0xffffffffffffffff));
        ppcVar12 = ppcVar12 + 2;
        psVar14 = psVar14 + 3;
        uVar3 = uVar9 + 1;
      } while (iVar5 == 0);
      bVar15 = 1 < uVar9;
    }
    else {
LAB_00265b68:
      bVar15 = false;
    }
    if (!bVar15) goto joined_r0x00265b7c;
  }
  else {
joined_r0x00265b7c:
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xc0,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
    }
  }
  if ((local_ab0.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xc1,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((local_ab0.query.builder.pos != local_ab0.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xc2,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if (local_ab0.fragment.ptr.isSet == false) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((local_ab0.fragment.ptr.field_1.value.content.size_ != 7) ||
      (iVar5 = bcmp(local_ab0.fragment.ptr.field_1.value.content.ptr,"garply",6), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xc3,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
               (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
  }
  Url::~Url(&local_ab0);
  pcVar11 = "";
  originalText_11.content.size_ = 0x26;
  originalText_11.content.ptr = "https://capnproto.org/foo/bar/#garply";
  expectedRestringified_11.content.size_ = 1;
  expectedRestringified_11.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_11,expectedRestringified_11,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,200,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xc9,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xca,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  pSVar2 = local_ab0.path.builder.ptr;
  local_ad8 = "foo";
  uStack_ad0 = 4;
  local_ac8[0] = "bar";
  local_ac8[1] = (char *)0x4;
  if ((long)local_ab0.path.builder.pos - (long)local_ab0.path.builder.ptr == 0x30) {
    sVar1 = ((local_ab0.path.builder.ptr)->content).size_;
    if (sVar1 + (sVar1 == 0) == 4) {
      if (sVar1 != 0) {
        pcVar11 = ((local_ab0.path.builder.ptr)->content).ptr;
      }
      iVar5 = bcmp(pcVar11,"foo",3);
      if (iVar5 != 0) goto LAB_00265df1;
      ppcVar12 = local_ac8 + 1;
      psVar14 = &pSVar2[1].content.size_;
      uVar3 = 1;
      do {
        uVar9 = uVar3;
        if (uVar9 == 2) break;
        sVar1 = *psVar14;
        pcVar11 = (char *)(sVar1 + (sVar1 == 0));
        if (pcVar11 != *ppcVar12) break;
        pcVar13 = "";
        if (sVar1 != 0) {
          pcVar13 = ((Array<char> *)(psVar14 + -1))->ptr;
        }
        iVar5 = bcmp(pcVar13,ppcVar12[-1],(size_t)(pcVar11 + 0xffffffffffffffff));
        ppcVar12 = ppcVar12 + 2;
        psVar14 = psVar14 + 3;
        uVar3 = uVar9 + 1;
      } while (iVar5 == 0);
      bVar15 = 1 < uVar9;
    }
    else {
LAB_00265df1:
      bVar15 = false;
    }
    if (!bVar15) goto joined_r0x00265e05;
  }
  else {
joined_r0x00265e05:
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[83]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0xcb,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\", \\\"bar\\\"})\""
                 ,(char (*) [83])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\", \"bar\"})"
                );
    }
  }
  if ((local_ab0.hasTrailingSlash == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xcc,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
               (char (*) [38])"failed: expected url.hasTrailingSlash");
  }
  if ((local_ab0.query.builder.pos != local_ab0.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xcd,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if (local_ab0.fragment.ptr.isSet == false) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((local_ab0.fragment.ptr.field_1.value.content.size_ != 7) ||
      (iVar5 = bcmp(local_ab0.fragment.ptr.field_1.value.content.ptr,"garply",6), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xce,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
               (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
  }
  Url::~Url(&local_ab0);
  originalText_12.content.size_ = 0x1d;
  originalText_12.content.ptr = "https://capnproto.org#garply";
  expectedRestringified_12.content.size_ = 1;
  expectedRestringified_12.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_12,expectedRestringified_12,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xd3,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xd4,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xd5,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  if ((local_ab0.path.builder.pos != local_ab0.path.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xd6,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
               (char (*) [37])"failed: expected url.path == nullptr");
  }
  if ((local_ab0.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xd7,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((local_ab0.query.builder.pos != local_ab0.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xd8,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if (local_ab0.fragment.ptr.isSet == false) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((local_ab0.fragment.ptr.field_1.value.content.size_ != 7) ||
      (iVar5 = bcmp(local_ab0.fragment.ptr.field_1.value.content.ptr,"garply",6), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xd9,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
               (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
  }
  Url::~Url(&local_ab0);
  originalText_13.content.size_ = 0x1e;
  originalText_13.content.ptr = "https://capnproto.org/#garply";
  expectedRestringified_13.content.size_ = 1;
  expectedRestringified_13.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_13,expectedRestringified_13,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xde,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xdf,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xe0,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  if ((local_ab0.path.builder.pos != local_ab0.path.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xe1,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
               (char (*) [37])"failed: expected url.path == nullptr");
  }
  if ((local_ab0.hasTrailingSlash == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xe2,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
               (char (*) [38])"failed: expected url.hasTrailingSlash");
  }
  if ((local_ab0.query.builder.pos != local_ab0.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xe3,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if (local_ab0.fragment.ptr.isSet == false) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((local_ab0.fragment.ptr.field_1.value.content.size_ != 7) ||
      (iVar5 = bcmp(local_ab0.fragment.ptr.field_1.value.content.ptr,"garply",6), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xe4,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(url.fragment) == \\\"garply\\\"\"",
               (char (*) [61])"failed: expected KJ_ASSERT_NONNULL(url.fragment) == \"garply\"");
  }
  Url::~Url(&local_ab0);
  originalText_14.content.size_ = 0x1a;
  originalText_14.content.ptr = "https://foo@capnproto.org";
  expectedRestringified_14.content.size_ = 1;
  expectedRestringified_14.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_14,expectedRestringified_14,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xe9,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  bVar15 = local_ab0.userInfo.ptr.isSet;
  if (local_ab0.userInfo.ptr.isSet == false) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((local_ab0.userInfo.ptr.field_1.value.username.content.size_ != 4) ||
      (iVar5 = bcmp(local_ab0.userInfo.ptr.field_1.value.username.content.ptr,"foo",3), iVar5 != 0))
     && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xeb,ERROR,"\"failed: expected \" \"user.username == \\\"foo\\\"\"",
               (char (*) [40])"failed: expected user.username == \"foo\"");
  }
  puVar6 = &DAT_00000018;
  if (bVar15 != false) {
    puVar6 = (undefined1 *)((long)&local_ab0 + 0x38U);
  }
  if ((*puVar6 == '\x01') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xec,ERROR,"\"failed: expected \" \"user.password == nullptr\"",
               (char (*) [42])"failed: expected user.password == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xed,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  if ((local_ab0.path.builder.pos != local_ab0.path.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xee,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
               (char (*) [37])"failed: expected url.path == nullptr");
  }
  if ((local_ab0.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xef,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((local_ab0.query.builder.pos != local_ab0.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xf0,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if ((local_ab0.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xf1,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
               (char (*) [41])"failed: expected url.fragment == nullptr");
  }
  Url::~Url(&local_ab0);
  originalText_15.content.size_ = 0x23;
  originalText_15.content.ptr = "https://$foo&:12+,34@capnproto.org";
  expectedRestringified_15.content.size_ = 1;
  expectedRestringified_15.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_15,expectedRestringified_15,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xf6,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  bVar15 = local_ab0.userInfo.ptr.isSet;
  if (local_ab0.userInfo.ptr.isSet == false) {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  if (((local_ab0.userInfo.ptr.field_1.value.username.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.userInfo.ptr.field_1.value.username.content.ptr,"$foo&",5), iVar5 != 0
      )) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xf8,ERROR,"\"failed: expected \" \"user.username == \\\"$foo&\\\"\"",
               (char (*) [42])"failed: expected user.username == \"$foo&\"");
  }
  puVar6 = &DAT_00000018;
  if (bVar15 != false) {
    puVar6 = (undefined1 *)((long)&local_ab0 + 0x38U);
  }
  puVar7 = (undefined8 *)&DAT_00000020;
  if (bVar15 != false) {
    puVar7 = (undefined8 *)((long)&local_ab0 + 0x40);
  }
  if (*puVar6 == '\0') {
    local_ae0.exception = (Exception *)0x0;
    local_ad8 = (char *)0x0;
    uStack_ad0 = 0;
    _::Debug::Fault::init
              (&local_ae0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
              );
    _::Debug::Fault::fatal(&local_ae0);
  }
  plVar10 = (long *)&DAT_00000028;
  if (bVar15 != false) {
    plVar10 = (long *)((long)&local_ab0 + 0x48);
  }
  if (((*plVar10 != 7) || (iVar5 = bcmp((void *)*puVar7,"12+,34",6), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xf9,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(user.password) == \\\"12+,34\\\"\"",
               (char (*) [62])"failed: expected KJ_ASSERT_NONNULL(user.password) == \"12+,34\"");
  }
  if (((local_ab0.host.content.size_ != 0xe) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"capnproto.org",0xd), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xfa,ERROR,"\"failed: expected \" \"url.host == \\\"capnproto.org\\\"\"",
               (char (*) [45])"failed: expected url.host == \"capnproto.org\"");
  }
  if ((local_ab0.path.builder.pos != local_ab0.path.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xfb,ERROR,"\"failed: expected \" \"url.path == nullptr\"",
               (char (*) [37])"failed: expected url.path == nullptr");
  }
  if ((local_ab0.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xfc,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((local_ab0.query.builder.pos != local_ab0.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xfd,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if ((local_ab0.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0xfe,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
               (char (*) [41])"failed: expected url.fragment == nullptr");
  }
  Url::~Url(&local_ab0);
  originalText_16.content.size_ = 0x20;
  originalText_16.content.ptr = "https://[2001:db8::1234]:80/foo";
  expectedRestringified_16.content.size_ = 1;
  expectedRestringified_16.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_16,expectedRestringified_16,(Options)0x1);
  if (((local_ab0.scheme.content.size_ != 6) ||
      (iVar5 = bcmp(local_ab0.scheme.content.ptr,"https",5), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x103,ERROR,"\"failed: expected \" \"url.scheme == \\\"https\\\"\"",
               (char (*) [39])"failed: expected url.scheme == \"https\"");
  }
  if ((local_ab0.userInfo.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x104,ERROR,"\"failed: expected \" \"url.userInfo == nullptr\"",
               (char (*) [41])"failed: expected url.userInfo == nullptr");
  }
  if (((local_ab0.host.content.size_ != 0x14) ||
      (iVar5 = bcmp(local_ab0.host.content.ptr,"[2001:db8::1234]:80",0x13), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x105,ERROR,"\"failed: expected \" \"url.host == \\\"[2001:db8::1234]:80\\\"\"",
               (char (*) [51])"failed: expected url.host == \"[2001:db8::1234]:80\"");
  }
  pSVar2 = local_ab0.path.builder.ptr;
  if ((long)local_ab0.path.builder.pos - (long)local_ab0.path.builder.ptr == 0x18) {
    if ((((local_ab0.path.builder.ptr)->content).size_ == 4) &&
       (iVar5 = bcmp(((local_ab0.path.builder.ptr)->content).ptr,"foo",3), iVar5 == 0)) {
      psVar14 = &pSVar2[1].content.size_;
      lVar4 = 1;
      do {
        lVar8 = lVar4;
        if ((lVar8 == 1) || (*psVar14 != 4)) break;
        iVar5 = bcmp(((Array<char> *)(psVar14 + -1))->ptr,"foo",3);
        psVar14 = psVar14 + 3;
        lVar4 = lVar8 + 1;
      } while (iVar5 == 0);
      bVar15 = lVar8 != 0;
    }
    else {
      bVar15 = false;
    }
    if (!bVar15) goto joined_r0x0026697c;
  }
  else {
joined_r0x0026697c:
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[76]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
                 ,0x106,ERROR,
                 "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo\\\"})\""
                 ,(char (*) [76])
                  "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo\"})");
    }
  }
  if ((local_ab0.hasTrailingSlash == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x107,ERROR,"\"failed: expected \" \"!url.hasTrailingSlash\"",
               (char (*) [39])"failed: expected !url.hasTrailingSlash");
  }
  if ((local_ab0.query.builder.pos != local_ab0.query.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x108,ERROR,"\"failed: expected \" \"url.query == nullptr\"",
               (char (*) [38])"failed: expected url.query == nullptr");
  }
  if ((local_ab0.fragment.ptr.isSet == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x109,ERROR,"\"failed: expected \" \"url.fragment == nullptr\"",
               (char (*) [41])"failed: expected url.fragment == nullptr");
  }
  Url::~Url(&local_ab0);
  pcVar11 = "";
  originalText_17.content.size_ = 0x24;
  originalText_17.content.ptr = "https://capnproto.org/foo%2Fbar/baz";
  expectedRestringified_17.content.size_ = 1;
  expectedRestringified_17.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_17,expectedRestringified_17,(Options)0x1);
  pSVar2 = local_ab0.path.builder.ptr;
  local_ad8 = "foo/bar";
  uStack_ad0 = 8;
  local_ac8[0] = "baz";
  local_ac8[1] = (char *)0x4;
  if ((long)local_ab0.path.builder.pos - (long)local_ab0.path.builder.ptr == 0x30) {
    sVar1 = ((local_ab0.path.builder.ptr)->content).size_;
    if (sVar1 + (sVar1 == 0) == 8) {
      if (sVar1 != 0) {
        pcVar11 = ((local_ab0.path.builder.ptr)->content).ptr;
      }
      iVar5 = bcmp(pcVar11,"foo/bar",7);
      if (iVar5 != 0) goto LAB_00266af3;
      ppcVar12 = local_ac8 + 1;
      psVar14 = &pSVar2[1].content.size_;
      uVar3 = 1;
      do {
        uVar9 = uVar3;
        if (uVar9 == 2) break;
        sVar1 = *psVar14;
        pcVar11 = (char *)(sVar1 + (sVar1 == 0));
        if (pcVar11 != *ppcVar12) break;
        pcVar13 = "";
        if (sVar1 != 0) {
          pcVar13 = ((Array<char> *)(psVar14 + -1))->ptr;
        }
        iVar5 = bcmp(pcVar13,ppcVar12[-1],(size_t)(pcVar11 + 0xffffffffffffffff));
        ppcVar12 = ppcVar12 + 2;
        psVar14 = psVar14 + 3;
        uVar3 = uVar9 + 1;
      } while (iVar5 == 0);
      bVar15 = 1 < uVar9;
    }
    else {
LAB_00266af3:
      bVar15 = false;
    }
    if (bVar15) goto LAB_00266b2d;
  }
  if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[87]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x10e,ERROR,
               "\"failed: expected \" \"url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\\\"foo/bar\\\", \\\"baz\\\"})\""
               ,(char (*) [87])
                "failed: expected url.path.asPtr() == kj::ArrayPtr<const StringPtr>({\"foo/bar\", \"baz\"})"
              );
  }
LAB_00266b2d:
  Url::~Url(&local_ab0);
  originalText_18.content.size_ = 0x1f;
  originalText_18.content.ptr = "https://capnproto.org/foo/bar?";
  expectedRestringified_18.content.size_ = 0x1e;
  expectedRestringified_18.content.ptr = "https://capnproto.org/foo/bar";
  parseAndCheck(&local_110,originalText_18,expectedRestringified_18,(Options)0x1);
  Url::~Url(&local_110);
  originalText_19.content.size_ = 0x20;
  originalText_19.content.ptr = "https://capnproto.org/foo/bar?#";
  expectedRestringified_19.content.size_ = 0x1f;
  expectedRestringified_19.content.ptr = "https://capnproto.org/foo/bar#";
  parseAndCheck(&local_1f0,originalText_19,expectedRestringified_19,(Options)0x1);
  Url::~Url(&local_1f0);
  originalText_20.content.size_ = 0x1f;
  originalText_20.content.ptr = "https://capnproto.org/foo/bar#";
  expectedRestringified_20.content.size_ = 1;
  expectedRestringified_20.content.ptr = "";
  parseAndCheck(&local_2d0,originalText_20,expectedRestringified_20,(Options)0x1);
  Url::~Url(&local_2d0);
  originalText_21.content.size_ = 0x1d;
  originalText_21.content.ptr = "hTtP://capNprotO.org/fOo/bAr";
  expectedRestringified_21.content.size_ = 0x1d;
  expectedRestringified_21.content.ptr = "http://capnproto.org/fOo/bAr";
  parseAndCheck(&local_3b0,originalText_21,expectedRestringified_21,(Options)0x1);
  Url::~Url(&local_3b0);
  originalText_22.content.size_ = 0x22;
  originalText_22.content.ptr = "https://bad_domain.capnproto.org/";
  expectedRestringified_22.content.size_ = 1;
  expectedRestringified_22.content.ptr = "";
  parseAndCheck(&local_490,originalText_22,expectedRestringified_22,(Options)0x1);
  Url::~Url(&local_490);
  originalText_23.content.size_ = 0x2b;
  originalText_23.content.ptr = "https://foo%25bar:baz%25qux@capnproto.org/";
  expectedRestringified_23.content.size_ = 1;
  expectedRestringified_23.content.ptr = "";
  parseAndCheck(&local_570,originalText_23,expectedRestringified_23,(Options)0x1);
  Url::~Url(&local_570);
  originalText_24.content.size_ = 0x20;
  originalText_24.content.ptr = "https://capnproto.org/foo%25bar";
  expectedRestringified_24.content.size_ = 1;
  expectedRestringified_24.content.ptr = "";
  parseAndCheck(&local_650,originalText_24,expectedRestringified_24,(Options)0x1);
  Url::~Url(&local_650);
  originalText_25.content.size_ = 0x2b;
  originalText_25.content.ptr = "https://capnproto.org/?foo%25bar=baz%25qux";
  expectedRestringified_25.content.size_ = 1;
  expectedRestringified_25.content.ptr = "";
  parseAndCheck(&local_730,originalText_25,expectedRestringified_25,(Options)0x1);
  Url::~Url(&local_730);
  originalText_26.content.size_ = 0x21;
  originalText_26.content.ptr = "https://capnproto.org/#foo%25bar";
  expectedRestringified_26.content.size_ = 1;
  expectedRestringified_26.content.ptr = "";
  parseAndCheck(&local_810,originalText_26,expectedRestringified_26,(Options)0x1);
  Url::~Url(&local_810);
  originalText_27.content.size_ = 0x3a;
  originalText_27.content.ptr = "https://capnproto.org/foo//bar///test//?foo=bar&&baz=qux&";
  expectedRestringified_27.content.size_ = 1;
  expectedRestringified_27.content.ptr = "";
  parseAndCheck(&local_8f0,originalText_27,expectedRestringified_27,(Options)0x101);
  Url::~Url(&local_8f0);
  originalText_28.content.size_ = 0x24;
  originalText_28.content.ptr = "https://capnproto.org/foo//../bar/.";
  expectedRestringified_28.content.size_ = 0x1f;
  expectedRestringified_28.content.ptr = "https://capnproto.org/foo/bar/";
  parseAndCheck(&local_9d0,originalText_28,expectedRestringified_28,(Options)0x101);
  Url::~Url(&local_9d0);
  originalText_29.content.size_ = 0xd;
  originalText_29.content.ptr = "https://foo/";
  expectedRestringified_29.content.size_ = 1;
  expectedRestringified_29.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_29,expectedRestringified_29,(Options)0x101);
  if ((local_ab0.path.builder.pos != local_ab0.path.builder.ptr) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,300,ERROR,"\"failed: expected \" \"url.path.size() == 0\"",
               (char (*) [38])"failed: expected url.path.size() == 0");
  }
  if ((local_ab0.hasTrailingSlash == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x12d,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
               (char (*) [38])"failed: expected url.hasTrailingSlash");
  }
  Url::~Url(&local_ab0);
  originalText_30.content.size_ = 0x11;
  originalText_30.content.ptr = "https://foo/bar/";
  expectedRestringified_30.content.size_ = 1;
  expectedRestringified_30.content.ptr = "";
  parseAndCheck(&local_ab0,originalText_30,expectedRestringified_30,(Options)0x101);
  if (((long)local_ab0.path.builder.pos - (long)local_ab0.path.builder.ptr != 0x18) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x132,ERROR,"\"failed: expected \" \"url.path.size() == 1\"",
               (char (*) [38])"failed: expected url.path.size() == 1");
  }
  if ((local_ab0.hasTrailingSlash == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x133,ERROR,"\"failed: expected \" \"url.hasTrailingSlash\"",
               (char (*) [38])"failed: expected url.hasTrailingSlash");
  }
  Url::~Url(&local_ab0);
  return;
}

Assistant:

TEST(AsyncIo, SimpleNetwork) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();

  Own<ConnectionReceiver> listener;
  Own<AsyncIoStream> server;
  Own<AsyncIoStream> client;

  char receiveBuffer[4];

  auto port = newPromiseAndFulfiller<uint>();

  port.promise.then([&](uint portnum) {
    return network.parseAddress("localhost", portnum);
  }).then([&](Own<NetworkAddress>&& result) {
    return result->connect();
  }).then([&](Own<AsyncIoStream>&& result) {
    client = kj::mv(result);
    return client->write("foo", 3);
  }).detach([](kj::Exception&& exception) {
    KJ_FAIL_EXPECT(exception);
  });

  kj::String result = network.parseAddress("*").then([&](Own<NetworkAddress>&& result) {
    listener = result->listen();
    port.fulfiller->fulfill(listener->getPort());
    return listener->accept();
  }).then([&](Own<AsyncIoStream>&& result) {
    server = kj::mv(result);
    return server->tryRead(receiveBuffer, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer, n);
  }).wait(ioContext.waitScope);

  EXPECT_EQ("foo", result);
}